

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfcd.h
# Opt level: O0

UBool icu_63::CollationFCD::mayHaveLccc(UChar32 c)

{
  bool local_15;
  uint local_10;
  int32_t i;
  UChar32 c_local;
  
  if (c < 0x300) {
    i._3_1_ = false;
  }
  else {
    local_10 = c;
    if (0xffff < c) {
      local_10 = (c >> 10) + 0xd7c0U & 0xffff;
    }
    local_15 = false;
    if ((byte)lcccIndex[(int)local_10 >> 5] != 0) {
      local_15 = (*(uint *)(lcccBits + (long)(int)(uint)(byte)lcccIndex[(int)local_10 >> 5] * 4) &
                 1 << ((byte)local_10 & 0x1f)) != 0;
    }
    i._3_1_ = local_15;
  }
  return i._3_1_;
}

Assistant:

static inline UBool mayHaveLccc(UChar32 c) {
        // Handles all of Unicode 0..10FFFF.
        // c can be negative, e.g., U_SENTINEL.
        // U+0300 is the first character with lccc!=0.
        if(c < 0x300) { return FALSE; }
        if(c > 0xffff) { c = U16_LEAD(c); }
        int32_t i;
        return
            (i = lcccIndex[c >> 5]) != 0 &&
            (lcccBits[i] & ((uint32_t)1 << (c & 0x1f))) != 0;
    }